

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O0

void dipfountain(obj *obj)

{
  boolean bVar1;
  xchar xVar2;
  xchar xVar3;
  int iVar4;
  char *pcVar5;
  obj *otmp_00;
  long lVar6;
  long lVar7;
  long local_50;
  long coin_loss;
  obj *poStack_20;
  int denomination;
  obj *otmp;
  long money;
  obj *obj_local;
  
  if (((u.uprops[0x12].intrinsic != 0) || (u.uprops[0x12].extrinsic != 0)) ||
     ((youmonst.data)->mlet == '\x05')) {
    floating_above("fountain");
    return;
  }
  if (((obj->otyp == 0x26) && (obj->quan == 1)) &&
     ((4 < u.ulevel && ((iVar4 = rn2(6), iVar4 == 0 && (obj->oartifact == '\0')))))) {
    pcVar5 = artiname(1);
    bVar1 = exist_artifact(0x26,pcVar5);
    if (bVar1 == '\0') {
      if (u.ualign.type == '\x01') {
        pline("From the murky depths, a hand reaches up to bless the sword.");
        pline("As the hand retreats, the fountain disappears!");
        pcVar5 = artiname(1);
        otmp_00 = oname(obj,pcVar5);
        discover_artifact('\x01');
        bless(otmp_00);
        *(uint *)&otmp_00->field_0x4a = *(uint *)&otmp_00->field_0x4a & 0xfffff3ff;
        *(uint *)&otmp_00->field_0x4a = *(uint *)&otmp_00->field_0x4a & 0xfffffcff;
        *(uint *)&otmp_00->field_0x4a = *(uint *)&otmp_00->field_0x4a & 0xffffefff | 0x1000;
        exercise(2,'\x01');
      }
      else {
        pline("A freezing mist rises from the water and envelopes the sword.");
        pline("The fountain disappears!");
        curse(obj);
        if ((-6 < obj->spe) && (iVar4 = rn2(3), iVar4 == 0)) {
          obj->spe = obj->spe + -1;
        }
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffefff;
        exercise(2,'\0');
      }
      update_inventory();
      level->locations[u.ux][u.uy].typ = '\x19';
      *(uint *)&level->locations[u.ux][u.uy].field_0x6 =
           *(uint *)&level->locations[u.ux][u.uy].field_0x6 & 0xfffffe0f;
      newsym((int)u.ux,(int)u.uy);
      (level->flags).nfountains = (level->flags).nfountains + 0xff;
      bVar1 = in_town((int)u.ux,(int)u.uy);
      if (bVar1 == '\0') {
        return;
      }
      angry_guards('\0');
      return;
    }
  }
  bVar1 = get_wet(obj);
  if ((bVar1 != '\0') && (iVar4 = rn2(2), iVar4 == 0)) {
    return;
  }
  if (obj->otyp == 0x141) {
    useup(obj);
    return;
  }
  iVar4 = rnd(0x1e);
  switch(iVar4) {
  case 0x10:
    curse(obj);
    break;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    if ((*(uint *)&obj->field_0x4a & 1) == 0) {
      pline("A feeling of loss comes over you.");
    }
    else {
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pline("The water glows for a moment.");
      }
      uncurse(obj);
    }
    break;
  case 0x15:
    dowaterdemon();
    break;
  case 0x16:
    dowaternymph();
    break;
  case 0x17:
    dowatersnakes();
    break;
  case 0x18:
    if ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 4 & 1) == 0) {
      dofindgem();
      break;
    }
  case 0x19:
    dogushforth(0);
    break;
  case 0x1a:
    pcVar5 = body_part(0);
    pline("A strange tingling runs up your %s.",pcVar5);
    break;
  case 0x1b:
    pline("You feel a sudden chill.");
    break;
  case 0x1c:
    pline("An urge to take a bath overwhelms you.");
    lVar6 = money_cnt(invent);
    if (10 < lVar6) {
      lVar6 = somegold(lVar6);
      otmp = (obj *)(lVar6 / 10);
      for (poStack_20 = invent; poStack_20 != (obj *)0x0 && 0 < (long)otmp;
          poStack_20 = poStack_20->nobj) {
        if (poStack_20->oclass == '\f') {
          iVar4 = (int)objects[poStack_20->otyp].oc_cost;
          local_50 = ((long)otmp->oextra + (long)iVar4 + -0x65) / (long)iVar4;
          if (poStack_20->quan <= local_50) {
            local_50 = (long)poStack_20->quan;
          }
          poStack_20->quan = poStack_20->quan - (int)local_50;
          otmp = (obj *)((long)otmp - local_50 * iVar4);
          if (poStack_20->quan == 0) {
            delobj(poStack_20);
          }
        }
      }
      pline("You lost some of your money in the fountain!");
      lVar6 = (long)u.ux;
      lVar7 = (long)u.uy;
      *(uint *)&level->locations[lVar6][lVar7].field_0x6 =
           *(uint *)&level->locations[lVar6][lVar7].field_0x6 & 0xfffffe0f |
           (*(uint *)&level->locations[lVar6][lVar7].field_0x6 >> 4 & 0x1e) << 4;
      exercise(2,'\0');
    }
    break;
  case 0x1d:
    if ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 4 & 1) == 0) {
      lVar6 = (long)u.ux;
      lVar7 = (long)u.uy;
      *(uint *)&level->locations[lVar6][lVar7].field_0x6 =
           *(uint *)&level->locations[lVar6][lVar7].field_0x6 & 0xfffffe0f |
           (*(uint *)&level->locations[lVar6][lVar7].field_0x6 >> 4 & 0x1f | 1) << 4;
      xVar2 = dunlevs_in_dungeon(&u.uz);
      xVar3 = dunlev(&u.uz);
      iVar4 = rnd((((int)xVar2 - (int)xVar3) + 1) * 2);
      mkgold((long)(iVar4 + 5),level,(int)u.ux,(int)u.uy);
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pline("Far below you, you see coins glistening in the water.");
      }
      exercise(2,'\x01');
      newsym((int)u.ux,(int)u.uy);
    }
  }
  update_inventory();
  dryup(u.ux,u.uy,'\x01');
  return;
}

Assistant:

void dipfountain(struct obj *obj)
{
	if (Levitation) {
		floating_above("fountain");
		return;
	}

	/* Don't grant Excalibur when there's more than one object.  */
	/* (quantity could be > 1 if merged daggers got polymorphed) */
	if (obj->otyp == LONG_SWORD && obj->quan == 1L
	    && u.ulevel >= 5 && !rn2(6)
	    && !obj->oartifact
	    && !exist_artifact(LONG_SWORD, artiname(ART_EXCALIBUR))) {

		if (u.ualign.type != A_LAWFUL) {
			/* Ha!  Trying to cheat her. */
			pline("A freezing mist rises from the water and envelopes the sword.");
			pline("The fountain disappears!");
			curse(obj);
			if (obj->spe > -6 && !rn2(3)) obj->spe--;
			obj->oerodeproof = FALSE;
			exercise(A_WIS, FALSE);
		} else {
			/* The lady of the lake acts! - Eric Backus */
			/* Be *REAL* nice */
	  pline("From the murky depths, a hand reaches up to bless the sword.");
			pline("As the hand retreats, the fountain disappears!");
			obj = oname(obj, artiname(ART_EXCALIBUR));
			discover_artifact(ART_EXCALIBUR);
			bless(obj);
			obj->oeroded = obj->oeroded2 = 0;
			obj->oerodeproof = TRUE;
			exercise(A_WIS, TRUE);
		}
		update_inventory();
		level->locations[u.ux][u.uy].typ = ROOM;
		level->locations[u.ux][u.uy].looted = 0;
		newsym(u.ux, u.uy);
		level->flags.nfountains--;
		if (in_town(u.ux, u.uy))
		    angry_guards(FALSE);
		return;
	} else if (get_wet(obj) && !rn2(2))
		return;

	/* Acid and water don't mix */
	if (obj->otyp == POT_ACID) {
	    useup(obj);
	    return;
	}

	switch (rnd(30)) {
		case 16: /* Curse the item */
			curse(obj);
			break;
		case 17:
		case 18:
		case 19:
		case 20: /* Uncurse the item */
			if (obj->cursed) {
			    if (!Blind)
				pline("The water glows for a moment.");
			    uncurse(obj);
			} else {
			    pline("A feeling of loss comes over you.");
			}
			break;
		case 21: /* Water Demon */
			dowaterdemon();
			break;
		case 22: /* Water Nymph */
			dowaternymph();
			break;
		case 23: /* an Endless Stream of Snakes */
			dowatersnakes();
			break;
		case 24: /* Find a gem */
			if (!FOUNTAIN_IS_LOOTED(u.ux,u.uy)) {
				dofindgem();
				break;
			}
		case 25: /* Water gushes forth */
			dogushforth(FALSE);
			break;
		case 26: /* Strange feeling */
			pline("A strange tingling runs up your %s.",
							body_part(ARM));
			break;
		case 27: /* Strange feeling */
			pline("You feel a sudden chill.");
			break;
		case 28: /* Strange feeling */
			pline("An urge to take a bath overwhelms you.");
			{
			    long money = money_cnt(invent);
			    struct obj *otmp;
                            if (money > 10) {
				/* Amount to loose.  Might get rounded up as fountains don't pay change... */
			        money = somegold(money) / 10; 
			        for (otmp = invent; otmp && money > 0; otmp = otmp->nobj) if (otmp->oclass == COIN_CLASS) {
				    int denomination = objects[otmp->otyp].oc_cost;
				    long coin_loss = (money + denomination - 1) / denomination;
                                    coin_loss = min(coin_loss, otmp->quan);
				    otmp->quan -= coin_loss;
				    money -= coin_loss * denomination;				  
				    if (!otmp->quan) delobj(otmp);
				}
			        pline("You lost some of your money in the fountain!");
				CLEAR_FOUNTAIN_LOOTED(u.ux,u.uy);
			        exercise(A_WIS, FALSE);
                            }
			}
			break;
		case 29: /* You see coins */

		/* We make fountains have more coins the closer you are to the
		 * surface.  After all, there will have been more people going
		 * by.	Just like a shopping mall!  Chris Woodbury  */

		    if (FOUNTAIN_IS_LOOTED(u.ux,u.uy)) break;
		    SET_FOUNTAIN_LOOTED(u.ux,u.uy);
		    mkgold((long)
			(rnd((dunlevs_in_dungeon(&u.uz)-dunlev(&u.uz)+1)*2)+5),
			level, u.ux, u.uy);
		    if (!Blind)
		pline("Far below you, you see coins glistening in the water.");
		    exercise(A_WIS, TRUE);
		    newsym(u.ux,u.uy);
		    break;
	}
	update_inventory();
	dryup(u.ux, u.uy, TRUE);
}